

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O1

void tchecker::clockbounds::fill_global_m_map(global_m_map_t *global_m_map,local_lu_map_t *param_2)

{
  uint uVar1;
  map_t *pmVar2;
  invalid_argument *this;
  ulong uVar3;
  ulong uVar4;
  
  if (global_m_map->_clock_nb != param_2->_clock_nb) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"*** fill_gloal_m_map: incompatible clock number");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pmVar2 = global_m_map->_M;
  uVar4 = (ulong)(pmVar2->super_array_capacity_t<unsigned_int>)._capacity;
  if (uVar4 != 0) {
    uVar3 = 0;
    do {
      (&pmVar2->_fam)[uVar3] = (no_storage_array_t<int>)0xc0000001;
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  uVar1 = param_2->_loc_nb;
  if ((ulong)uVar1 != 0) {
    uVar4 = 0;
    do {
      if (param_2->_loc_nb <= uVar4) {
        __assert_fail("id < _loc_nb",
                      "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/clockbounds/clockbounds.cc"
                      ,0xc0,
                      "const tchecker::clockbounds::map_t &tchecker::clockbounds::local_lu_map_t::L(tchecker::loc_id_t) const"
                     );
      }
      update(global_m_map->_M,
             (param_2->_L).
             super__Vector_base<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar4]);
      if (param_2->_loc_nb <= uVar4) {
        __assert_fail("id < _loc_nb",
                      "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/clockbounds/clockbounds.cc"
                      ,0xcc,
                      "const tchecker::clockbounds::map_t &tchecker::clockbounds::local_lu_map_t::U(tchecker::loc_id_t) const"
                     );
      }
      update(global_m_map->_M,
             (param_2->_U).
             super__Vector_base<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar4]);
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  return;
}

Assistant:

tchecker::clockbounds::map_t & global_m_map_t::M(void) { return *_M; }